

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

void __thiscall Nova::Timer::Release_Timer(Timer *this,int id)

{
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  int local_4;
  
  this_00 = (vector<int,std::allocator<int>> *)this->free_timers;
  __position._M_current = *(int **)(this_00 + 8);
  if (__position._M_current == *(int **)(this_00 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_00,__position,&local_4)
    ;
  }
  else {
    *__position._M_current = id;
    *(int **)(this_00 + 8) = __position._M_current + 1;
  }
  return;
}

Assistant:

void Release_Timer(const int id)
    {free_timers->Append(id);}